

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktUniformBlockCase.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::ubo::anon_unknown_0::UniformBlockCaseInstance::iterate
          (TestStatus *__return_storage_ptr__,UniformBlockCaseInstance *this)

{
  int *piVar1;
  deUint32 *pdVar2;
  Context *pCVar3;
  undefined8 *puVar4;
  pointer pBVar5;
  ProgramCollection<vk::ProgramBinary> *pPVar6;
  TestLog *pTVar7;
  TextureFormat TVar8;
  Handle<(vk::HandleType)17> HVar9;
  Handle<(vk::HandleType)9> image;
  Handle<(vk::HandleType)17> HVar10;
  Handle<(vk::HandleType)16> HVar11;
  Handle<(vk::HandleType)16> HVar12;
  Handle<(vk::HandleType)14> HVar13;
  deUint32 dVar14;
  ChannelOrder CVar15;
  deUint32 dVar16;
  VkResult VVar17;
  VkDevice device;
  VkQueue pVVar18;
  InstanceInterface *pIVar19;
  VkPhysicalDevice pVVar20;
  DeviceInterface *pDVar21;
  VkDevice pVVar22;
  Allocator *pAVar23;
  ulong uVar24;
  DeviceInterface *pDVar25;
  DescriptorPoolBuilder *this_00;
  const_iterator cVar26;
  long lVar27;
  uint *puVar28;
  mapped_type *pmVar29;
  ProgramBinary *pPVar30;
  uint uVar31;
  uint uVar32;
  int iVar33;
  Surface *surface_00;
  UniformLayout *pUVar34;
  void *__buf;
  TestStatus *pTVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  int iVar39;
  size_t blockNdx;
  size_t i;
  ulong uVar40;
  ulong uVar41;
  RefBase<vk::Handle<(vk::HandleType)22>_> *pRVar42;
  deUint32 queueFamilyIndex;
  ChannelType CStack_7d4;
  _Base_ptr p_Stack_7d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_7c8;
  void *local_7b8;
  undefined8 uStack_7b0;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  DeviceInterface *local_790;
  VkAttachmentReference attachmentReference;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> offsets_1;
  RefBase<vk::Handle<(vk::HandleType)17>_> local_6e8;
  Surface *local_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  TestStatus *local_6a8;
  ulong local_6a0;
  RefBase<vk::Handle<(vk::HandleType)9>_> local_698;
  Surface surface;
  vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_> descriptors;
  UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> indicesAlloc;
  UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> positionsAlloc;
  UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> readImageAlloc;
  RefBase<vk::Handle<(vk::HandleType)17>_> local_5f8;
  RefBase<vk::Handle<(vk::HandleType)22>_> local_5d8;
  RefBase<vk::Handle<(vk::HandleType)16>_> local_5b8;
  RefBase<vk::Handle<(vk::HandleType)19>_> local_598;
  RefBase<vk::Handle<(vk::HandleType)8>_> local_578;
  RefBase<vk::Handle<(vk::HandleType)8>_> local_558;
  VkPipelineInputAssemblyStateCreateInfo inputAssemblyStateParams;
  UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> colorImageAlloc;
  VkPipelineViewportStateCreateInfo viewportStateParams;
  VkVertexInputBindingDescription vertexBinding;
  VkPhysicalDeviceProperties properties;
  RefBase<vk::Handle<(vk::HandleType)18>_> local_188;
  RefBase<vk::Handle<(vk::HandleType)14>_> local_168;
  RefBase<vk::Handle<(vk::HandleType)14>_> local_148;
  RefBase<vk::Handle<(vk::HandleType)23>_> local_128;
  RefBase<vk::Handle<(vk::HandleType)21>_> local_108;
  RefBase<vk::Handle<(vk::HandleType)13>_> local_e8;
  VkRect2D scissor;
  VkClearValue clearValue;
  undefined8 local_a8;
  VkDeviceSize offsets [1];
  VkCommandBufferBeginInfo beginInfo;
  VkDescriptorSetAllocateInfo descriptorSetAllocateInfo;
  
  local_790 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  device = Context::getDevice((this->super_TestInstance).m_context);
  pVVar18 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  dVar14 = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&properties,
               (this->super_TestInstance).m_context,0x40,0x80);
  local_558.m_data.deleter.m_device = (VkDevice)properties._16_8_;
  local_558.m_data.deleter.m_allocator = (VkAllocationCallbacks *)properties.deviceName._4_8_;
  local_558.m_data.object.m_internal._0_4_ = properties.apiVersion;
  local_558.m_data.object.m_internal._4_4_ = properties.driverVersion;
  local_558.m_data.deleter.m_deviceIface = (DeviceInterface *)properties._8_8_;
  properties.apiVersion = 0;
  properties.driverVersion = 0;
  properties.vendorID = 0;
  properties.deviceID = 0;
  properties.deviceType = VK_PHYSICAL_DEVICE_TYPE_OTHER;
  properties.deviceName[0] = '\0';
  properties.deviceName[1] = '\0';
  properties.deviceName[2] = '\0';
  properties.deviceName[3] = '\0';
  properties.deviceName[4] = '\0';
  properties.deviceName[5] = '\0';
  properties.deviceName[6] = '\0';
  properties.deviceName[7] = '\0';
  properties.deviceName[8] = '\0';
  properties.deviceName[9] = '\0';
  properties.deviceName[10] = '\0';
  properties.deviceName[0xb] = '\0';
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)8>_> *)&properties);
  allocateAndBindMemory
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&properties,
             (this->super_TestInstance).m_context,(VkBuffer)local_558.m_data.object.m_internal,
             (MemoryRequirement)0x1);
  positionsAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
       (Allocation *)properties._0_8_;
  properties.apiVersion = 0;
  properties.driverVersion = 0;
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
            ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&properties);
  createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&properties,
               (this->super_TestInstance).m_context,0x18,0xc0);
  local_578.m_data.deleter.m_device = (VkDevice)properties._16_8_;
  local_578.m_data.deleter.m_allocator = (VkAllocationCallbacks *)properties.deviceName._4_8_;
  local_578.m_data.object.m_internal._0_4_ = properties.apiVersion;
  local_578.m_data.object.m_internal._4_4_ = properties.driverVersion;
  local_578.m_data.deleter.m_deviceIface = (DeviceInterface *)properties._8_8_;
  properties.apiVersion = 0;
  properties.driverVersion = 0;
  properties.vendorID = 0;
  properties.deviceID = 0;
  properties.deviceType = VK_PHYSICAL_DEVICE_TYPE_OTHER;
  properties.deviceName[0] = '\0';
  properties.deviceName[1] = '\0';
  properties.deviceName[2] = '\0';
  properties.deviceName[3] = '\0';
  properties.deviceName[4] = '\0';
  properties.deviceName[5] = '\0';
  properties.deviceName[6] = '\0';
  properties.deviceName[7] = '\0';
  properties.deviceName[8] = '\0';
  properties.deviceName[9] = '\0';
  properties.deviceName[10] = '\0';
  properties.deviceName[0xb] = '\0';
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)8>_> *)&properties);
  allocateAndBindMemory
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&properties,
             (this->super_TestInstance).m_context,(VkBuffer)local_578.m_data.object.m_internal,
             (MemoryRequirement)0x1);
  indicesAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
       (Allocation *)properties._0_8_;
  properties.apiVersion = 0;
  properties.driverVersion = 0;
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
            ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&properties);
  pCVar3 = (this->super_TestInstance).m_context;
  pIVar19 = Context::getInstanceInterface(pCVar3);
  pVVar20 = Context::getPhysicalDevice(pCVar3);
  (*pIVar19->_vptr_InstanceInterface[5])(pIVar19,pVVar20,&properties);
  local_6a0 = (ulong)(uint)properties.limits.minUniformBufferOffsetAlignment;
  puVar4 = (undefined8 *)
           (positionsAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
            m_data.ptr)->m_hostPtr;
  puVar4[6] = &DAT_3f8000003f800000;
  puVar4[7] = 0x3f80000000000000;
  puVar4[4] = 0xbf8000003f800000;
  puVar4[5] = 0x3f80000000000000;
  puVar4[2] = 0x3f800000bf800000;
  puVar4[3] = 0x3f80000000000000;
  *puVar4 = 0xbf800000bf800000;
  puVar4[1] = 0x3f80000000000000;
  ::vk::flushMappedMemoryRange
            (local_790,device,
             (VkDeviceMemory)
             ((positionsAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
               m_data.ptr)->m_memory).m_internal,
             (positionsAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
              m_data.ptr)->m_offset,0x40);
  puVar4 = (undefined8 *)
           (indicesAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
            m_data.ptr)->m_hostPtr;
  *puVar4 = 0x100000000;
  puVar4[1] = &DAT_200000002;
  puVar4[2] = 0x300000001;
  ::vk::flushMappedMemoryRange
            (local_790,device,
             (VkDeviceMemory)
             ((indicesAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
               m_data.ptr)->m_memory).m_internal,
             (indicesAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
              m_data.ptr)->m_offset,0x18);
  pCVar3 = (this->super_TestInstance).m_context;
  local_6a8 = __return_storage_ptr__;
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex(pCVar3);
  properties.deviceName._52_8_ = &queueFamilyIndex;
  properties.apiVersion = 0xe;
  properties.vendorID = 0;
  properties.deviceID = 0;
  properties.deviceType = VK_PHYSICAL_DEVICE_TYPE_OTHER;
  properties.deviceName[0] = '\x01';
  properties.deviceName[1] = '\0';
  properties.deviceName[2] = '\0';
  properties.deviceName[3] = '\0';
  properties.deviceName[4] = '%';
  properties.deviceName[5] = '\0';
  properties.deviceName[6] = '\0';
  properties.deviceName[7] = '\0';
  properties.deviceName[8] = 'd';
  properties.deviceName[9] = '\0';
  properties.deviceName[10] = '\0';
  properties.deviceName[0xb] = '\0';
  properties.deviceName[0xc] = 'd';
  properties.deviceName[0xd] = '\0';
  properties.deviceName[0xe] = '\0';
  properties.deviceName[0xf] = '\0';
  properties.deviceName[0x10] = '\x01';
  properties.deviceName[0x11] = '\0';
  properties.deviceName[0x12] = '\0';
  properties.deviceName[0x13] = '\0';
  properties.deviceName[0x14] = '\x01';
  properties.deviceName[0x15] = '\0';
  properties.deviceName[0x16] = '\0';
  properties.deviceName[0x17] = '\0';
  properties.deviceName[0x18] = '\x01';
  properties.deviceName[0x19] = '\0';
  properties.deviceName[0x1a] = '\0';
  properties.deviceName[0x1b] = '\0';
  properties.deviceName[0x1c] = '\x01';
  properties.deviceName[0x1d] = '\0';
  properties.deviceName[0x1e] = '\0';
  properties.deviceName[0x1f] = '\0';
  properties.deviceName[0x20] = '\0';
  properties.deviceName[0x21] = '\0';
  properties.deviceName[0x22] = '\0';
  properties.deviceName[0x23] = '\0';
  properties.deviceName[0x24] = '\x11';
  properties.deviceName[0x25] = '\0';
  properties.deviceName[0x26] = '\0';
  properties.deviceName[0x27] = '\0';
  properties.deviceName[0x28] = '\0';
  properties.deviceName[0x29] = '\0';
  properties.deviceName[0x2a] = '\0';
  properties.deviceName[0x2b] = '\0';
  properties.deviceName[0x2c] = '\x01';
  properties.deviceName[0x2d] = '\0';
  properties.deviceName[0x2e] = '\0';
  properties.deviceName[0x2f] = '\0';
  properties.deviceName._60_8_ = (ulong)(uint)properties.deviceName._64_4_ << 0x20;
  pDVar21 = Context::getDeviceInterface(pCVar3);
  pVVar22 = Context::getDevice(pCVar3);
  ::vk::createImage((Move<vk::Handle<(vk::HandleType)9>_> *)&offsets_1,pDVar21,pVVar22,
                    (VkImageCreateInfo *)&properties,(VkAllocationCallbacks *)0x0);
  local_698.m_data.object.m_internal = offsets_1._M_t._M_impl._0_8_;
  local_698.m_data.deleter.m_deviceIface =
       (DeviceInterface *)offsets_1._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
  local_698.m_data.deleter.m_device =
       (VkDevice)offsets_1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  local_698.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)offsets_1._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  offsets_1._M_t._M_impl._0_8_ = 0;
  offsets_1._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  offsets_1._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  offsets_1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  offsets_1._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)9>_> *)&offsets_1);
  image.m_internal = local_698.m_data.object.m_internal;
  pCVar3 = (this->super_TestInstance).m_context;
  pDVar21 = Context::getDeviceInterface(pCVar3);
  pVVar22 = Context::getDevice(pCVar3);
  ::vk::getImageMemoryRequirements
            ((VkMemoryRequirements *)&properties,pDVar21,pVVar22,(VkImage)image.m_internal);
  pAVar23 = Context::getDefaultAllocator(pCVar3);
  (*pAVar23->_vptr_Allocator[3])(&offsets_1,pAVar23,&properties,0);
  pVVar22 = Context::getDevice(pCVar3);
  (*pDVar21->_vptr_DeviceInterface[0xd])
            (pDVar21,pVVar22,image.m_internal,*(undefined8 *)(offsets_1._M_t._M_impl._0_8_ + 8));
  colorImageAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
       (Allocation *)offsets_1._M_t._M_impl._0_8_;
  offsets_1._M_t._M_impl._0_8_ = 0;
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
            ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&offsets_1);
  pCVar3 = (this->super_TestInstance).m_context;
  properties.apiVersion = 0xf;
  properties.vendorID = 0;
  properties.deviceID = 0;
  properties._16_8_ = properties._16_8_ & 0xffffffff00000000;
  properties.deviceName[4] = (undefined1)local_698.m_data.object.m_internal;
  properties.deviceName[5] = local_698.m_data.object.m_internal._1_1_;
  properties.deviceName[6] = local_698.m_data.object.m_internal._2_1_;
  properties.deviceName[7] = local_698.m_data.object.m_internal._3_1_;
  properties.deviceName[8] = local_698.m_data.object.m_internal._4_1_;
  properties.deviceName[9] = local_698.m_data.object.m_internal._5_1_;
  properties.deviceName[10] = local_698.m_data.object.m_internal._6_1_;
  properties.deviceName[0xb] = local_698.m_data.object.m_internal._7_1_;
  properties.deviceName[0xc] = '\x01';
  properties.deviceName[0xd] = '\0';
  properties.deviceName[0xe] = '\0';
  properties.deviceName[0xf] = '\0';
  properties.deviceName[0x10] = '%';
  properties.deviceName[0x11] = '\0';
  properties.deviceName[0x12] = '\0';
  properties.deviceName[0x13] = '\0';
  properties.deviceName[0x14] = '\x03';
  properties.deviceName[0x15] = '\0';
  properties.deviceName[0x16] = '\0';
  properties.deviceName[0x17] = '\0';
  properties.deviceName[0x18] = '\x04';
  properties.deviceName[0x19] = '\0';
  properties.deviceName[0x1a] = '\0';
  properties.deviceName[0x1b] = '\0';
  properties.deviceName[0x1c] = '\x05';
  properties.deviceName[0x1d] = '\0';
  properties.deviceName[0x1e] = '\0';
  properties.deviceName[0x1f] = '\0';
  properties.deviceName[0x20] = '\x06';
  properties.deviceName[0x21] = '\0';
  properties.deviceName[0x22] = '\0';
  properties.deviceName[0x23] = '\0';
  properties.deviceName[0x24] = '\x01';
  properties.deviceName[0x25] = '\0';
  properties.deviceName[0x26] = '\0';
  properties.deviceName[0x27] = '\0';
  properties.deviceName[0x28] = '\0';
  properties.deviceName[0x29] = '\0';
  properties.deviceName[0x2a] = '\0';
  properties.deviceName[0x2b] = '\0';
  properties.deviceName[0x2c] = '\x01';
  properties.deviceName[0x2d] = '\0';
  properties.deviceName[0x2e] = '\0';
  properties.deviceName[0x2f] = '\0';
  properties.deviceName[0x30] = '\0';
  properties.deviceName[0x31] = '\0';
  properties.deviceName[0x32] = '\0';
  properties.deviceName[0x33] = '\0';
  properties.deviceName[0x34] = '\x01';
  properties.deviceName[0x35] = '\0';
  properties.deviceName[0x36] = '\0';
  properties.deviceName[0x37] = '\0';
  pDVar21 = Context::getDeviceInterface(pCVar3);
  pVVar22 = Context::getDevice(pCVar3);
  uVar41 = 0;
  ::vk::createImageView
            ((Move<vk::Handle<(vk::HandleType)13>_> *)&offsets_1,pDVar21,pVVar22,
             (VkImageViewCreateInfo *)&properties,(VkAllocationCallbacks *)0x0);
  local_e8.m_data.object.m_internal = offsets_1._M_t._M_impl._0_8_;
  local_e8.m_data.deleter.m_deviceIface =
       (DeviceInterface *)offsets_1._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
  local_e8.m_data.deleter.m_device =
       (VkDevice)offsets_1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  local_e8.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)offsets_1._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  offsets_1._M_t._M_impl._0_8_ = 0;
  offsets_1._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  offsets_1._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  offsets_1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  offsets_1._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)13>_> *)&offsets_1);
  uVar24 = ((long)(this->m_layout->blocks).
                  super__Vector_base<vkt::ubo::BlockLayoutEntry,_std::allocator<vkt::ubo::BlockLayoutEntry>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->m_layout->blocks).
                 super__Vector_base<vkt::ubo::BlockLayoutEntry,_std::allocator<vkt::ubo::BlockLayoutEntry>_>
                 ._M_impl.super__Vector_impl_data._M_start) / 0x50;
  local_7c8._M_allocated_capacity = 0;
  uVar40 = uVar24 & 0xffffffff;
  if ((int)uVar24 < 1) {
    uVar40 = uVar41;
  }
  queueFamilyIndex = R;
  CStack_7d4 = SNORM_INT8;
  p_Stack_7d0 = (_Base_ptr)0x0;
  iVar37 = -1;
  for (; uVar40 * 0x50 - uVar41 != 0; uVar41 = uVar41 + 0x50) {
    pBVar5 = (this->m_layout->blocks).
             super__Vector_base<vkt::ubo::BlockLayoutEntry,_std::allocator<vkt::ubo::BlockLayoutEntry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (*(int *)((long)&pBVar5->bindingNdx + uVar41) == iVar37) {
      piVar1 = (int *)((long)&p_Stack_7d0[-1]._M_right + 4);
      *piVar1 = *piVar1 + 1;
    }
    else {
      properties.apiVersion = 1;
      std::vector<int,_std::allocator<int>_>::emplace_back<int>
                ((vector<int,_std::allocator<int>_> *)&queueFamilyIndex,(int *)&properties);
      iVar37 = *(int *)((long)&pBVar5->bindingNdx + uVar41);
    }
  }
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)&properties);
  pDVar21 = local_790;
  for (uVar40 = 0; uVar40 < (ulong)((long)p_Stack_7d0 - (long)_queueFamilyIndex >> 2);
      uVar40 = uVar40 + 1) {
    dVar16 = *(deUint32 *)((long)_queueFamilyIndex + uVar40 * 4);
    if ((int)dVar16 < 1) {
      ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                ((DescriptorSetLayoutBuilder *)&properties,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,
                 0x7fffffff);
    }
    else {
      ::vk::DescriptorSetLayoutBuilder::addArrayBinding
                ((DescriptorSetLayoutBuilder *)&properties,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,dVar16,
                 0x7fffffff);
    }
  }
  pDVar25 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  pVVar22 = Context::getDevice((this->super_TestInstance).m_context);
  ::vk::DescriptorSetLayoutBuilder::build
            ((Move<vk::Handle<(vk::HandleType)19>_> *)&offsets_1,
             (DescriptorSetLayoutBuilder *)&properties,pDVar25,pVVar22,0);
  ::vk::DescriptorSetLayoutBuilder::~DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)&properties);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&queueFamilyIndex);
  local_598.m_data.object.m_internal = offsets_1._M_t._M_impl._0_8_;
  local_598.m_data.deleter.m_deviceIface =
       (DeviceInterface *)offsets_1._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
  local_598.m_data.deleter.m_device =
       (VkDevice)offsets_1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  local_598.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)offsets_1._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  offsets_1._M_t._M_impl._0_8_ = 0;
  offsets_1._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  offsets_1._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  offsets_1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  offsets_1._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)19>_> *)&offsets_1);
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)&offsets_1);
  this_00 = ::vk::DescriptorPoolBuilder::addType
                      ((DescriptorPoolBuilder *)&offsets_1,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,
                       (deUint32)
                       (((long)(this->m_layout->blocks).
                               super__Vector_base<vkt::ubo::BlockLayoutEntry,_std::allocator<vkt::ubo::BlockLayoutEntry>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->m_layout->blocks).
                              super__Vector_base<vkt::ubo::BlockLayoutEntry,_std::allocator<vkt::ubo::BlockLayoutEntry>_>
                              ._M_impl.super__Vector_impl_data._M_start) / 0x50));
  pDVar25 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  pVVar22 = Context::getDevice((this->super_TestInstance).m_context);
  ::vk::DescriptorPoolBuilder::build
            ((Move<vk::Handle<(vk::HandleType)21>_> *)&properties,this_00,pDVar25,pVVar22,1,1);
  std::_Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>::
  ~_Vector_base((_Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_> *
                )&offsets_1);
  local_108.m_data.object.m_internal._0_4_ = properties.apiVersion;
  local_108.m_data.object.m_internal._4_4_ = properties.driverVersion;
  local_108.m_data.deleter.m_deviceIface = (DeviceInterface *)properties._8_8_;
  local_108.m_data.deleter.m_device = (VkDevice)properties._16_8_;
  local_108.m_data.deleter.m_allocator = (VkAllocationCallbacks *)properties.deviceName._4_8_;
  properties.apiVersion = 0;
  properties.driverVersion = 0;
  properties.vendorID = 0;
  properties.deviceID = 0;
  properties.deviceType = VK_PHYSICAL_DEVICE_TYPE_OTHER;
  properties.deviceName[0] = '\0';
  properties.deviceName[1] = '\0';
  properties.deviceName[2] = '\0';
  properties.deviceName[3] = '\0';
  properties.deviceName[4] = '\0';
  properties.deviceName[5] = '\0';
  properties.deviceName[6] = '\0';
  properties.deviceName[7] = '\0';
  properties.deviceName[8] = '\0';
  properties.deviceName[9] = '\0';
  properties.deviceName[10] = '\0';
  properties.deviceName[0xb] = '\0';
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)21>_> *)&properties);
  descriptorSetAllocateInfo.sType = VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO;
  descriptorSetAllocateInfo.pNext = (void *)0x0;
  descriptorSetAllocateInfo.descriptorPool.m_internal = local_108.m_data.object.m_internal;
  descriptorSetAllocateInfo.descriptorSetCount = 1;
  descriptorSetAllocateInfo.pSetLayouts = (VkDescriptorSetLayout *)&local_598;
  ::vk::allocateDescriptorSet
            ((Move<vk::Handle<(vk::HandleType)22>_> *)&properties,pDVar21,device,
             &descriptorSetAllocateInfo);
  local_5d8.m_data.deleter.m_device = (VkDevice)properties._16_8_;
  local_5d8.m_data.deleter.m_pool.m_internal._0_1_ = properties.deviceName[4];
  local_5d8.m_data.deleter.m_pool.m_internal._1_1_ = properties.deviceName[5];
  local_5d8.m_data.deleter.m_pool.m_internal._2_1_ = properties.deviceName[6];
  local_5d8.m_data.deleter.m_pool.m_internal._3_1_ = properties.deviceName[7];
  local_5d8.m_data.deleter.m_pool.m_internal._4_1_ = properties.deviceName[8];
  local_5d8.m_data.deleter.m_pool.m_internal._5_1_ = properties.deviceName[9];
  local_5d8.m_data.deleter.m_pool.m_internal._6_1_ = properties.deviceName[10];
  local_5d8.m_data.deleter.m_pool.m_internal._7_1_ = properties.deviceName[0xb];
  local_5d8.m_data.object.m_internal._0_4_ = properties.apiVersion;
  local_5d8.m_data.object.m_internal._4_4_ = properties.driverVersion;
  local_5d8.m_data.deleter.m_deviceIface = (DeviceInterface *)properties._8_8_;
  properties.apiVersion = 0;
  properties.driverVersion = 0;
  properties.vendorID = 0;
  properties.deviceID = 0;
  properties.deviceType = VK_PHYSICAL_DEVICE_TYPE_OTHER;
  properties.deviceName[0] = '\0';
  properties.deviceName[1] = '\0';
  properties.deviceName[2] = '\0';
  properties.deviceName[3] = '\0';
  properties.deviceName[4] = '\0';
  properties.deviceName[5] = '\0';
  properties.deviceName[6] = '\0';
  properties.deviceName[7] = '\0';
  properties.deviceName[8] = '\0';
  properties.deviceName[9] = '\0';
  properties.deviceName[10] = '\0';
  properties.deviceName[0xb] = '\0';
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)22>_> *)&properties);
  iVar37 = (int)(((long)(this->m_layout->blocks).
                        super__Vector_base<vkt::ubo::BlockLayoutEntry,_std::allocator<vkt::ubo::BlockLayoutEntry>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->m_layout->blocks).
                       super__Vector_base<vkt::ubo::BlockLayoutEntry,_std::allocator<vkt::ubo::BlockLayoutEntry>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0x50);
  std::vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>::vector
            (&descriptors,(long)iVar37,(allocator_type *)&properties);
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder
            ((DescriptorSetUpdateBuilder *)&properties);
  if (this->m_bufferMode == BUFFERMODE_PER_BLOCK) {
    CVar15 = R;
    while( true ) {
      queueFamilyIndex = CVar15;
      if (iVar37 <= (int)CVar15) break;
      pBVar5 = (this->m_layout->blocks).
               super__Vector_base<vkt::ubo::BlockLayoutEntry,_std::allocator<vkt::ubo::BlockLayoutEntry>_>
               ._M_impl.super__Vector_impl_data._M_start;
      cVar26 = std::
               _Rb_tree<int,_std::pair<const_int,_void_*>,_std::_Select1st<std::pair<const_int,_void_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
               ::find(&this->m_blockPointers->_M_t,(key_type_conflict *)&queueFamilyIndex);
      addUniformData((VkDescriptorBufferInfo *)&offsets_1,this,pBVar5[(int)CVar15].size,
                     cVar26._M_node[1]._M_parent);
      lVar27 = (long)(int)queueFamilyIndex;
      descriptors.
      super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>.
      _M_impl.super__Vector_impl_data._M_start[lVar27].range =
           (VkDeviceSize)offsets_1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      descriptors.
      super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>.
      _M_impl.super__Vector_impl_data._M_start[lVar27].buffer.m_internal =
           offsets_1._M_t._M_impl._0_8_;
      descriptors.
      super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>.
      _M_impl.super__Vector_impl_data._M_start[lVar27].offset =
           offsets_1._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
      pBVar5 = pBVar5 + (int)CVar15;
      offsets_1._M_t._M_impl._0_4_ = pBVar5->bindingNdx;
      offsets_1._M_t._M_impl._4_4_ = pBVar5->instanceNdx;
      ::vk::DescriptorSetUpdateBuilder::writeSingle
                ((DescriptorSetUpdateBuilder *)&properties,
                 (VkDescriptorSet)local_5d8.m_data.object.m_internal,(Location *)&offsets_1,
                 VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,
                 descriptors.
                 super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start + lVar27);
      CVar15 = queueFamilyIndex + A;
    }
  }
  else {
    offsets_1._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &offsets_1._M_t._M_impl.super__Rb_tree_header._M_header;
    offsets_1._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
         offsets_1._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
    offsets_1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    offsets_1._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    iVar33 = (int)local_6a0;
    CVar15 = R;
    uVar32 = 0;
    offsets_1._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         offsets_1._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    while( true ) {
      queueFamilyIndex = CVar15;
      if (iVar37 <= (int)CVar15) break;
      puVar28 = (uint *)std::
                        map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                        operator[](&offsets_1,(key_type_conflict *)&queueFamilyIndex);
      uVar31 = iVar33 + -1 + uVar32 & -iVar33;
      if ((int)local_6a0 < 1) {
        uVar31 = uVar32;
      }
      *puVar28 = uVar31;
      uVar32 = uVar31 + (this->m_layout->blocks).
                        super__Vector_base<vkt::ubo::BlockLayoutEntry,_std::allocator<vkt::ubo::BlockLayoutEntry>_>
                        ._M_impl.super__Vector_impl_data._M_start[(int)queueFamilyIndex].size;
      CVar15 = queueFamilyIndex + A;
    }
    queueFamilyIndex = R;
    CStack_7d4 = SNORM_INT8;
    p_Stack_7d0 = (_Base_ptr)0x0;
    local_7c8._M_allocated_capacity = 0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&queueFamilyIndex,
               (ulong)uVar32);
    dVar16 = 0;
    while( true ) {
      local_6e8.m_data.object.m_internal._0_4_ = dVar16;
      if (iVar37 <= (int)dVar16) break;
      pmVar29 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                operator[](&offsets_1,(key_type_conflict *)&local_6e8);
      TVar8 = _queueFamilyIndex;
      iVar33 = *pmVar29;
      cVar26 = std::
               _Rb_tree<int,_std::pair<const_int,_void_*>,_std::_Select1st<std::pair<const_int,_void_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
               ::find(&this->m_blockPointers->_M_t,(key_type_conflict *)&local_6e8);
      memcpy((void *)((long)TVar8 + (long)iVar33),cVar26._M_node[1]._M_parent,
             (long)(this->m_layout->blocks).
                   super__Vector_base<vkt::ubo::BlockLayoutEntry,_std::allocator<vkt::ubo::BlockLayoutEntry>_>
                   ._M_impl.super__Vector_impl_data._M_start
                   [(int)(deUint32)local_6e8.m_data.object.m_internal].size);
      dVar16 = (deUint32)local_6e8.m_data.object.m_internal + 1;
    }
    addUniformData((VkDescriptorBufferInfo *)&local_6e8,this,uVar32,(void *)_queueFamilyIndex);
    HVar9.m_internal = local_6e8.m_data.object.m_internal;
    dVar16 = 0;
    while( true ) {
      attachmentReference.attachment = dVar16;
      if (iVar37 <= (int)dVar16) break;
      pBVar5 = (this->m_layout->blocks).
               super__Vector_base<vkt::ubo::BlockLayoutEntry,_std::allocator<vkt::ubo::BlockLayoutEntry>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar32 = pBVar5[(int)dVar16].size;
      puVar28 = (uint *)std::
                        map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                        operator[](&offsets_1,(key_type_conflict *)&attachmentReference);
      uVar31 = *puVar28;
      lVar27 = (long)(int)attachmentReference.attachment;
      descriptors.
      super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>.
      _M_impl.super__Vector_impl_data._M_start[lVar27].buffer.m_internal = HVar9.m_internal;
      descriptors.
      super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>.
      _M_impl.super__Vector_impl_data._M_start[lVar27].offset = (ulong)uVar31;
      descriptors.
      super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>.
      _M_impl.super__Vector_impl_data._M_start[lVar27].range = (ulong)uVar32;
      pBVar5 = pBVar5 + (int)dVar16;
      local_6e8.m_data.object.m_internal._0_4_ = pBVar5->bindingNdx;
      local_6e8.m_data.object.m_internal._4_4_ = pBVar5->instanceNdx;
      ::vk::DescriptorSetUpdateBuilder::writeSingle
                ((DescriptorSetUpdateBuilder *)&properties,
                 (VkDescriptorSet)local_5d8.m_data.object.m_internal,(Location *)&local_6e8,
                 VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,
                 descriptors.
                 super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start + lVar27);
      dVar16 = attachmentReference.attachment + 1;
    }
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&queueFamilyIndex);
    std::
    _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
    ::~_Rb_tree(&offsets_1._M_t);
  }
  pDVar21 = local_790;
  ::vk::DescriptorSetUpdateBuilder::update
            ((DescriptorSetUpdateBuilder *)&properties,local_790,device);
  ::vk::DescriptorSetUpdateBuilder::~DescriptorSetUpdateBuilder
            ((DescriptorSetUpdateBuilder *)&properties);
  pVVar22 = Context::getDevice((this->super_TestInstance).m_context);
  pDVar25 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  queueFamilyIndex = R;
  CStack_7d4 = FLOAT_UNSIGNED_INT_24_8_REV;
  p_Stack_7d0 = (_Base_ptr)0x100000001;
  local_7c8._M_allocated_capacity = 0x200000000;
  local_7c8._8_8_ = (VkAllocationCallbacks *)0x200000001;
  local_7b8 = (void *)CONCAT44(local_7b8._4_4_,2);
  properties.deviceName._12_8_ = &attachmentReference;
  attachmentReference.attachment = 0;
  attachmentReference.layout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
  properties.deviceType = VK_PHYSICAL_DEVICE_TYPE_OTHER;
  properties.deviceName[0] = '\0';
  properties.deviceName[1] = '\0';
  properties.deviceName[2] = '\0';
  properties.deviceName[3] = '\0';
  properties.deviceName[0x14] = '\0';
  properties.deviceName[0x15] = '\0';
  properties.deviceName[0x16] = '\0';
  properties.deviceName[0x17] = '\0';
  properties.deviceName[0x18] = '\0';
  properties.deviceName[0x19] = '\0';
  properties.deviceName[0x1a] = '\0';
  properties.deviceName[0x1b] = '\0';
  properties.deviceName[0x2c] = '\0';
  properties.deviceName[0x2d] = '\0';
  properties.deviceName[0x2e] = '\0';
  properties.deviceName[0x2f] = '\0';
  properties.deviceName[0x30] = '\0';
  properties.deviceName[0x31] = '\0';
  properties.deviceName[0x32] = '\0';
  properties.deviceName[0x33] = '\0';
  properties.deviceName[0x1c] = '\0';
  properties.deviceName[0x1d] = '\0';
  properties.deviceName[0x1e] = '\0';
  properties.deviceName[0x1f] = '\0';
  properties.deviceName[0x20] = '\0';
  properties.deviceName[0x21] = '\0';
  properties.deviceName[0x22] = '\0';
  properties.deviceName[0x23] = '\0';
  properties.deviceName[0x24] = '\0';
  properties.deviceName[0x25] = '\0';
  properties.deviceName[0x26] = '\0';
  properties.deviceName[0x27] = '\0';
  properties.deviceName[0x28] = '\0';
  properties.deviceName[0x29] = '\0';
  properties.deviceName[0x2a] = '\0';
  properties.deviceName[0x2b] = '\0';
  properties.apiVersion = 0;
  properties.driverVersion = 0;
  properties.vendorID = 0;
  properties.deviceID = 0;
  properties.deviceName[4] = '\x01';
  properties.deviceName[5] = '\0';
  properties.deviceName[6] = '\0';
  properties.deviceName[7] = '\0';
  properties.deviceName[8] = '\0';
  properties.deviceName[9] = '\0';
  properties.deviceName[10] = '\0';
  properties.deviceName[0xb] = '\0';
  offsets_1._M_t._M_impl._0_4_ = 0x26;
  offsets_1._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  offsets_1._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  offsets_1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&DAT_100000000;
  offsets_1._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)CONCAT44(offsets_1._M_t._M_impl.super__Rb_tree_header._M_header._M_right._4_4_,1);
  offsets_1._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&queueFamilyIndex;
  offsets_1._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)&properties;
  ::vk::createRenderPass
            ((Move<vk::Handle<(vk::HandleType)17>_> *)&local_6e8,pDVar25,pVVar22,
             (VkRenderPassCreateInfo *)&offsets_1,(VkAllocationCallbacks *)0x0);
  local_5f8.m_data.object.m_internal = local_6e8.m_data.object.m_internal;
  local_5f8.m_data.deleter.m_deviceIface = local_6e8.m_data.deleter.m_deviceIface;
  local_5f8.m_data.deleter.m_device = local_6e8.m_data.deleter.m_device;
  local_5f8.m_data.deleter.m_allocator = local_6e8.m_data.deleter.m_allocator;
  local_6e8.m_data.object.m_internal._0_4_ = 0;
  local_6e8.m_data.object.m_internal._4_4_ = 0;
  local_6e8.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_6e8.m_data.deleter.m_device = (VkDevice)0x0;
  local_6e8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::~RefBase(&local_6e8);
  HVar9.m_internal = local_5f8.m_data.object.m_internal;
  queueFamilyIndex = (undefined4)local_e8.m_data.object.m_internal;
  CStack_7d4 = local_e8.m_data.object.m_internal._4_4_;
  pVVar22 = Context::getDevice((this->super_TestInstance).m_context);
  pDVar25 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  HVar10.m_internal = local_5f8.m_data.object.m_internal;
  properties.apiVersion = 0x25;
  properties.vendorID = 0;
  properties.deviceID = 0;
  properties._16_8_ = properties._16_8_ & 0xffffffff00000000;
  local_5f8.m_data.object.m_internal._0_1_ = (undefined1)HVar9.m_internal;
  local_5f8.m_data.object.m_internal._1_1_ = SUB81(HVar9.m_internal,1);
  local_5f8.m_data.object.m_internal._2_1_ = SUB81(HVar9.m_internal,2);
  local_5f8.m_data.object.m_internal._3_1_ = SUB81(HVar9.m_internal,3);
  local_5f8.m_data.object.m_internal._4_1_ = SUB81(HVar9.m_internal,4);
  local_5f8.m_data.object.m_internal._5_1_ = SUB81(HVar9.m_internal,5);
  local_5f8.m_data.object.m_internal._6_1_ = SUB81(HVar9.m_internal,6);
  local_5f8.m_data.object.m_internal._7_1_ = SUB81(HVar9.m_internal,7);
  properties.deviceName[4] = (undefined1)local_5f8.m_data.object.m_internal;
  properties.deviceName[5] = local_5f8.m_data.object.m_internal._1_1_;
  properties.deviceName[6] = local_5f8.m_data.object.m_internal._2_1_;
  properties.deviceName[7] = local_5f8.m_data.object.m_internal._3_1_;
  properties.deviceName[8] = local_5f8.m_data.object.m_internal._4_1_;
  properties.deviceName[9] = local_5f8.m_data.object.m_internal._5_1_;
  properties.deviceName[10] = local_5f8.m_data.object.m_internal._6_1_;
  properties.deviceName[0xb] = local_5f8.m_data.object.m_internal._7_1_;
  properties.deviceName[0xc] = '\x01';
  properties.deviceName[0xd] = '\0';
  properties.deviceName[0xe] = '\0';
  properties.deviceName[0xf] = '\0';
  properties.deviceName[0x1c] = 'd';
  properties.deviceName[0x1d] = '\0';
  properties.deviceName[0x1e] = '\0';
  properties.deviceName[0x1f] = '\0';
  properties.deviceName[0x20] = 'd';
  properties.deviceName[0x21] = '\0';
  properties.deviceName[0x22] = '\0';
  properties.deviceName[0x23] = '\0';
  properties.deviceName[0x24] = '\x01';
  properties.deviceName[0x25] = '\0';
  properties.deviceName[0x26] = '\0';
  properties.deviceName[0x27] = '\0';
  local_5f8.m_data.object.m_internal = HVar10.m_internal;
  properties.deviceName._20_8_ = (_Base_ptr)&queueFamilyIndex;
  ::vk::createFramebuffer
            ((Move<vk::Handle<(vk::HandleType)23>_> *)&offsets_1,pDVar25,pVVar22,
             (VkFramebufferCreateInfo *)&properties,(VkAllocationCallbacks *)0x0);
  local_128.m_data.object.m_internal = offsets_1._M_t._M_impl._0_8_;
  local_128.m_data.deleter.m_deviceIface =
       (DeviceInterface *)offsets_1._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
  local_128.m_data.deleter.m_device =
       (VkDevice)offsets_1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  local_128.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)offsets_1._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  offsets_1._M_t._M_impl._0_8_ = 0;
  offsets_1._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  offsets_1._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  offsets_1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  offsets_1._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)23>_> *)&offsets_1);
  pCVar3 = (this->super_TestInstance).m_context;
  properties.apiVersion = 0x1e;
  properties.vendorID = 0;
  properties.deviceID = 0;
  properties.deviceType = VK_PHYSICAL_DEVICE_TYPE_OTHER;
  properties.deviceName[0] = '\x01';
  properties.deviceName[1] = '\0';
  properties.deviceName[2] = '\0';
  properties.deviceName[3] = '\0';
  properties.deviceName._12_8_ = (ulong)(uint)properties.deviceName._16_4_ << 0x20;
  queueFamilyIndex = (undefined4)local_598.m_data.object.m_internal;
  CStack_7d4 = local_598.m_data.object.m_internal._4_4_;
  properties.deviceName[0x14] = '\0';
  properties.deviceName[0x15] = '\0';
  properties.deviceName[0x16] = '\0';
  properties.deviceName[0x17] = '\0';
  properties.deviceName[0x18] = '\0';
  properties.deviceName[0x19] = '\0';
  properties.deviceName[0x1a] = '\0';
  properties.deviceName[0x1b] = '\0';
  properties.deviceName._4_8_ = (_Base_ptr)&queueFamilyIndex;
  pDVar25 = Context::getDeviceInterface(pCVar3);
  pVVar22 = Context::getDevice(pCVar3);
  ::vk::createPipelineLayout
            ((Move<vk::Handle<(vk::HandleType)16>_> *)&offsets_1,pDVar25,pVVar22,
             (VkPipelineLayoutCreateInfo *)&properties,(VkAllocationCallbacks *)0x0);
  local_5b8.m_data.object.m_internal = offsets_1._M_t._M_impl._0_8_;
  local_5b8.m_data.deleter.m_deviceIface =
       (DeviceInterface *)offsets_1._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
  local_5b8.m_data.deleter.m_device =
       (VkDevice)offsets_1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  local_5b8.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)offsets_1._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  offsets_1._M_t._M_impl._0_8_ = 0;
  offsets_1._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  offsets_1._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  offsets_1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  offsets_1._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)16>_> *)&offsets_1);
  pPVar6 = ((this->super_TestInstance).m_context)->m_progCollection;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&offsets_1,"vert",(allocator<char> *)&queueFamilyIndex);
  pPVar30 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar6,(string *)&offsets_1);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&properties,pDVar21,device,pPVar30,0);
  local_148.m_data.deleter.m_device = (VkDevice)properties._16_8_;
  local_148.m_data.deleter.m_allocator = (VkAllocationCallbacks *)properties.deviceName._4_8_;
  local_148.m_data.object.m_internal._0_4_ = properties.apiVersion;
  local_148.m_data.object.m_internal._4_4_ = properties.driverVersion;
  local_148.m_data.deleter.m_deviceIface = (DeviceInterface *)properties._8_8_;
  properties.apiVersion = 0;
  properties.driverVersion = 0;
  properties.vendorID = 0;
  properties.deviceID = 0;
  properties.deviceType = VK_PHYSICAL_DEVICE_TYPE_OTHER;
  properties.deviceName[0] = '\0';
  properties.deviceName[1] = '\0';
  properties.deviceName[2] = '\0';
  properties.deviceName[3] = '\0';
  properties.deviceName[4] = '\0';
  properties.deviceName[5] = '\0';
  properties.deviceName[6] = '\0';
  properties.deviceName[7] = '\0';
  properties.deviceName[8] = '\0';
  properties.deviceName[9] = '\0';
  properties.deviceName[10] = '\0';
  properties.deviceName[0xb] = '\0';
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)14>_> *)&properties);
  std::__cxx11::string::~string((string *)&offsets_1);
  pPVar6 = ((this->super_TestInstance).m_context)->m_progCollection;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&offsets_1,"frag",(allocator<char> *)&queueFamilyIndex);
  pPVar30 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar6,(string *)&offsets_1);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&properties,pDVar21,device,pPVar30,0);
  local_168.m_data.deleter.m_device = (VkDevice)properties._16_8_;
  local_168.m_data.deleter.m_allocator = (VkAllocationCallbacks *)properties.deviceName._4_8_;
  local_168.m_data.object.m_internal._0_4_ = properties.apiVersion;
  local_168.m_data.object.m_internal._4_4_ = properties.driverVersion;
  local_168.m_data.deleter.m_deviceIface = (DeviceInterface *)properties._8_8_;
  properties.apiVersion = 0;
  properties.driverVersion = 0;
  properties.vendorID = 0;
  properties.deviceID = 0;
  properties.deviceType = VK_PHYSICAL_DEVICE_TYPE_OTHER;
  properties.deviceName[0] = '\0';
  properties.deviceName[1] = '\0';
  properties.deviceName[2] = '\0';
  properties.deviceName[3] = '\0';
  properties.deviceName[4] = '\0';
  properties.deviceName[5] = '\0';
  properties.deviceName[6] = '\0';
  properties.deviceName[7] = '\0';
  properties.deviceName[8] = '\0';
  properties.deviceName[9] = '\0';
  properties.deviceName[10] = '\0';
  properties.deviceName[0xb] = '\0';
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)14>_> *)&properties);
  std::__cxx11::string::~string((string *)&offsets_1);
  HVar13.m_internal = local_148.m_data.object.m_internal;
  HVar11.m_internal = local_5b8.m_data.object.m_internal;
  HVar9.m_internal = local_5f8.m_data.object.m_internal;
  pVVar22 = Context::getDevice((this->super_TestInstance).m_context);
  pDVar21 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  HVar12.m_internal = local_5b8.m_data.object.m_internal;
  HVar10.m_internal = local_5f8.m_data.object.m_internal;
  vertexBinding.inputRate = VK_VERTEX_INPUT_RATE_VERTEX;
  offsets_1._M_t._M_impl._0_4_ = 0x12;
  offsets_1._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  offsets_1._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  vertexBinding.binding = 0;
  vertexBinding.stride = 0x10;
  offsets_1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&DAT_100000000;
  offsets_1._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)HVar13.m_internal;
  offsets_1._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x989565;
  offsets_1._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  attachmentReference.attachment = 0x13;
  offsets[0] = 0;
  viewportStateParams.scissorCount = 1;
  properties.deviceName._20_8_ = &inputAssemblyStateParams;
  inputAssemblyStateParams.flags = 0;
  inputAssemblyStateParams.topology = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST;
  inputAssemblyStateParams.primitiveRestartEnable = 0;
  inputAssemblyStateParams._28_4_ = 0;
  inputAssemblyStateParams.sType = VK_STRUCTURE_TYPE_PIPELINE_INPUT_ASSEMBLY_STATE_CREATE_INFO;
  inputAssemblyStateParams._4_4_ = 0;
  inputAssemblyStateParams.pNext = (void *)0x0;
  viewportStateParams.pViewports = (VkViewport *)&clearValue;
  local_a8 = 0x3f80000000000000;
  clearValue._0_4_ = 0.0;
  clearValue._4_4_ = 0;
  clearValue._8_8_ = 0x42c8000042c80000;
  viewportStateParams.pScissors = &scissor;
  scissor.offset.x = 0;
  scissor.offset.y = 0;
  scissor.extent.width = 100;
  scissor.extent.height = 100;
  properties.deviceName._36_8_ = &viewportStateParams;
  viewportStateParams.sType = VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_STATE_CREATE_INFO;
  viewportStateParams.pNext = (void *)0x0;
  viewportStateParams.flags = 0;
  viewportStateParams.viewportCount = 1;
  p_Stack_7d0 = (_Base_ptr)0x0;
  local_7a8 = 0;
  local_7b8 = (void *)0x0;
  uStack_7b0 = 0;
  local_7c8._M_allocated_capacity = 0;
  local_7c8._8_8_ = (VkAllocationCallbacks *)0x0;
  queueFamilyIndex = DS|L;
  CStack_7d4 = SNORM_INT8;
  uStack_7a0 = 0x3f800000;
  properties.deviceName._52_8_ = &beginInfo;
  beginInfo.pNext = (void *)0x0;
  beginInfo.pInheritanceInfo = (VkCommandBufferInheritanceInfo *)0x0;
  beginInfo.sType = VK_STRUCTURE_TYPE_PIPELINE_MULTISAMPLE_STATE_CREATE_INFO;
  beginInfo._4_4_ = 0;
  beginInfo.flags = 0;
  beginInfo._20_4_ = 1;
  local_6c8 = &surface;
  surface.m_pixels.m_cap = 1;
  surface.m_width = 0;
  surface.m_height = 1;
  surface.m_pixels.m_ptr = (void *)0x0;
  local_6e8.m_data.object.m_internal._0_4_ = 0x1a;
  local_6e8.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_6e8.m_data.deleter.m_device = (VkDevice)0x0;
  properties.apiVersion = 0x1c;
  properties.vendorID = 0;
  properties.deviceID = 0;
  properties.deviceType = VK_PHYSICAL_DEVICE_TYPE_OTHER;
  properties.deviceName[0] = '\x02';
  properties.deviceName[1] = '\0';
  properties.deviceName[2] = '\0';
  properties.deviceName[3] = '\0';
  properties.deviceName._12_8_ = &attachmentReference;
  properties.deviceName[0x1c] = '\0';
  properties.deviceName[0x1d] = '\0';
  properties.deviceName[0x1e] = '\0';
  properties.deviceName[0x1f] = '\0';
  properties.deviceName[0x20] = '\0';
  properties.deviceName[0x21] = '\0';
  properties.deviceName[0x22] = '\0';
  properties.deviceName[0x23] = '\0';
  local_6e8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x100000003;
  properties.deviceName._44_8_ = &queueFamilyIndex;
  properties.deviceName[0x3c] = '\0';
  properties.deviceName[0x3d] = '\0';
  properties.deviceName[0x3e] = '\0';
  properties.deviceName[0x3f] = '\0';
  properties.deviceName[0x40] = '\0';
  properties.deviceName[0x41] = '\0';
  properties.deviceName[0x42] = '\0';
  properties.deviceName[0x43] = '\0';
  properties.deviceName._68_8_ = &local_6e8;
  properties.deviceName[0x4c] = '\0';
  properties.deviceName[0x4d] = '\0';
  properties.deviceName[0x4e] = '\0';
  properties.deviceName[0x4f] = '\0';
  properties.deviceName[0x50] = '\0';
  properties.deviceName[0x51] = '\0';
  properties.deviceName[0x52] = '\0';
  properties.deviceName[0x53] = '\0';
  local_5b8.m_data.object.m_internal._0_1_ = (undefined1)HVar11.m_internal;
  local_5b8.m_data.object.m_internal._1_1_ = SUB81(HVar11.m_internal,1);
  local_5b8.m_data.object.m_internal._2_1_ = SUB81(HVar11.m_internal,2);
  local_5b8.m_data.object.m_internal._3_1_ = SUB81(HVar11.m_internal,3);
  local_5b8.m_data.object.m_internal._4_1_ = SUB81(HVar11.m_internal,4);
  local_5b8.m_data.object.m_internal._5_1_ = SUB81(HVar11.m_internal,5);
  local_5b8.m_data.object.m_internal._6_1_ = SUB81(HVar11.m_internal,6);
  local_5b8.m_data.object.m_internal._7_1_ = SUB81(HVar11.m_internal,7);
  properties.deviceName[0x54] = (undefined1)local_5b8.m_data.object.m_internal;
  properties.deviceName[0x55] = local_5b8.m_data.object.m_internal._1_1_;
  properties.deviceName[0x56] = local_5b8.m_data.object.m_internal._2_1_;
  properties.deviceName[0x57] = local_5b8.m_data.object.m_internal._3_1_;
  properties.deviceName[0x58] = local_5b8.m_data.object.m_internal._4_1_;
  properties.deviceName[0x59] = local_5b8.m_data.object.m_internal._5_1_;
  properties.deviceName[0x5a] = local_5b8.m_data.object.m_internal._6_1_;
  properties.deviceName[0x5b] = local_5b8.m_data.object.m_internal._7_1_;
  local_5f8.m_data.object.m_internal._0_1_ = (undefined1)HVar9.m_internal;
  local_5f8.m_data.object.m_internal._1_1_ = SUB81(HVar9.m_internal,1);
  local_5f8.m_data.object.m_internal._2_1_ = SUB81(HVar9.m_internal,2);
  local_5f8.m_data.object.m_internal._3_1_ = SUB81(HVar9.m_internal,3);
  local_5f8.m_data.object.m_internal._4_1_ = SUB81(HVar9.m_internal,4);
  local_5f8.m_data.object.m_internal._5_1_ = SUB81(HVar9.m_internal,5);
  local_5f8.m_data.object.m_internal._6_1_ = SUB81(HVar9.m_internal,6);
  local_5f8.m_data.object.m_internal._7_1_ = SUB81(HVar9.m_internal,7);
  properties.deviceName[0x5c] = (undefined1)local_5f8.m_data.object.m_internal;
  properties.deviceName[0x5d] = local_5f8.m_data.object.m_internal._1_1_;
  properties.deviceName[0x5e] = local_5f8.m_data.object.m_internal._2_1_;
  properties.deviceName[0x5f] = local_5f8.m_data.object.m_internal._3_1_;
  properties.deviceName[0x60] = local_5f8.m_data.object.m_internal._4_1_;
  properties.deviceName[0x61] = local_5f8.m_data.object.m_internal._5_1_;
  properties.deviceName[0x62] = local_5f8.m_data.object.m_internal._6_1_;
  properties.deviceName[99] = local_5f8.m_data.object.m_internal._7_1_;
  properties.deviceName[100] = '\0';
  properties.deviceName[0x65] = '\0';
  properties.deviceName[0x66] = '\0';
  properties.deviceName[0x67] = '\0';
  properties.deviceName[0x6c] = '\0';
  properties.deviceName[0x6d] = '\0';
  properties.deviceName[0x6e] = '\0';
  properties.deviceName[0x6f] = '\0';
  properties.deviceName[0x70] = '\0';
  properties.deviceName[0x71] = '\0';
  properties.deviceName[0x72] = '\0';
  properties.deviceName[0x73] = '\0';
  local_6c0 = 0;
  uStack_6b8 = 0;
  properties.deviceName[0x74] = '\0';
  properties.deviceName[0x75] = '\0';
  properties.deviceName[0x76] = '\0';
  properties.deviceName[0x77] = '\0';
  local_5f8.m_data.object.m_internal = HVar10.m_internal;
  local_5b8.m_data.object.m_internal = HVar12.m_internal;
  properties.deviceName._4_8_ = (string *)&offsets_1;
  ::vk::createGraphicsPipeline
            ((Move<vk::Handle<(vk::HandleType)18>_> *)&readImageAlloc,pDVar21,pVVar22,
             (VkPipelineCache)0x0,(VkGraphicsPipelineCreateInfo *)&properties,
             (VkAllocationCallbacks *)0x0);
  local_188.m_data.object.m_internal =
       (deUint64)
       readImageAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
       ptr;
  local_188.m_data.deleter.m_deviceIface =
       (DeviceInterface *)
       readImageAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
       _8_8_;
  readImageAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
       (Allocation *)0x0;
  readImageAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._8_8_
       = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)18>_> *)&readImageAlloc);
  pCVar3 = (this->super_TestInstance).m_context;
  dVar16 = Context::getUniversalQueueFamilyIndex(pCVar3);
  pDVar21 = Context::getDeviceInterface(pCVar3);
  pVVar22 = Context::getDevice(pCVar3);
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&properties,pDVar21,pVVar22,2,dVar16,
             (VkAllocationCallbacks *)0x0);
  local_6e8.m_data.deleter.m_device = (VkDevice)properties._16_8_;
  local_6e8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)properties.deviceName._4_8_;
  local_6e8.m_data.object.m_internal._0_4_ = properties.apiVersion;
  local_6e8.m_data.object.m_internal._4_4_ = properties.driverVersion;
  local_6e8.m_data.deleter.m_deviceIface = (DeviceInterface *)properties._8_8_;
  properties.apiVersion = 0;
  properties.driverVersion = 0;
  properties.vendorID = 0;
  properties.deviceID = 0;
  properties.deviceType = VK_PHYSICAL_DEVICE_TYPE_OTHER;
  properties.deviceName[0] = '\0';
  properties.deviceName[1] = '\0';
  properties.deviceName[2] = '\0';
  properties.deviceName[3] = '\0';
  properties.deviceName[4] = '\0';
  properties.deviceName[5] = '\0';
  properties.deviceName[6] = '\0';
  properties.deviceName[7] = '\0';
  properties.deviceName[8] = '\0';
  properties.deviceName[9] = '\0';
  properties.deviceName[10] = '\0';
  properties.deviceName[0xb] = '\0';
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)24>_> *)&properties);
  HVar9.m_internal = local_6e8.m_data.object.m_internal;
  pCVar3 = (this->super_TestInstance).m_context;
  pDVar21 = Context::getDeviceInterface(pCVar3);
  pVVar22 = Context::getDevice(pCVar3);
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)&properties,pDVar21,pVVar22,
             (VkCommandPool)HVar9.m_internal,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  attachmentReference.attachment = properties.apiVersion;
  attachmentReference.layout = properties.driverVersion;
  properties.apiVersion = 0;
  properties.driverVersion = 0;
  properties.vendorID = 0;
  properties.deviceID = 0;
  properties.deviceType = VK_PHYSICAL_DEVICE_TYPE_OTHER;
  properties.deviceName[0] = '\0';
  properties.deviceName[1] = '\0';
  properties.deviceName[2] = '\0';
  properties.deviceName[3] = '\0';
  properties.deviceName[4] = '\0';
  properties.deviceName[5] = '\0';
  properties.deviceName[6] = '\0';
  properties.deviceName[7] = '\0';
  properties.deviceName[8] = '\0';
  properties.deviceName[9] = '\0';
  properties.deviceName[10] = '\0';
  properties.deviceName[0xb] = '\0';
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
            ((RefBase<vk::VkCommandBuffer_s_*> *)&properties);
  createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&properties,
               (this->super_TestInstance).m_context,40000,2);
  viewportStateParams._16_8_ = properties._16_8_;
  viewportStateParams.pViewports = (VkViewport *)properties.deviceName._4_8_;
  viewportStateParams.sType = properties.apiVersion;
  viewportStateParams._4_4_ = properties.driverVersion;
  viewportStateParams.pNext = (void *)properties._8_8_;
  properties.apiVersion = 0;
  properties.driverVersion = 0;
  properties.vendorID = 0;
  properties.deviceID = 0;
  properties.deviceType = VK_PHYSICAL_DEVICE_TYPE_OTHER;
  properties.deviceName[0] = '\0';
  properties.deviceName[1] = '\0';
  properties.deviceName[2] = '\0';
  properties.deviceName[3] = '\0';
  properties.deviceName[4] = '\0';
  properties.deviceName[5] = '\0';
  properties.deviceName[6] = '\0';
  properties.deviceName[7] = '\0';
  properties.deviceName[8] = '\0';
  properties.deviceName[9] = '\0';
  properties.deviceName[10] = '\0';
  properties.deviceName[0xb] = '\0';
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)8>_> *)&properties);
  allocateAndBindMemory
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&properties,
             (this->super_TestInstance).m_context,(VkBuffer)viewportStateParams._0_8_,
             (MemoryRequirement)0x1);
  readImageAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
       (Allocation *)properties._0_8_;
  properties.apiVersion = 0;
  properties.driverVersion = 0;
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
            ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&properties);
  pDVar21 = local_790;
  beginInfo.flags = 0;
  beginInfo._20_4_ = 0;
  beginInfo.pInheritanceInfo = (VkCommandBufferInheritanceInfo *)0x0;
  beginInfo.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO;
  beginInfo._4_4_ = 0;
  beginInfo.pNext = (void *)0x0;
  VVar17 = (*local_790->_vptr_DeviceInterface[0x49])(local_790,attachmentReference);
  ::vk::checkResult(VVar17,"vk.beginCommandBuffer(*cmdBuffer, &beginInfo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/ubo/vktUniformBlockCase.cpp"
                    ,0x6b3);
  clearValue._0_4_ = 0.125;
  clearValue._4_4_ = 0x3e800000;
  offsets_1._M_t._M_impl._0_4_ = 0x2b;
  offsets_1._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  offsets_1._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  clearValue._8_8_ = 0x3f8000003f400000;
  offsets_1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)local_5f8.m_data.object.m_internal;
  offsets_1._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)local_128.m_data.object.m_internal;
  offsets_1._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  offsets_1._M_t._M_impl.super__Rb_tree_header._M_node_count = 0x6400000064;
  properties.apiVersion = 0x2d;
  properties.vendorID = 0;
  properties.deviceID = 0;
  properties.deviceType = VK_PHYSICAL_DEVICE_TYPE_OTHER;
  properties.deviceName[0] = '\0';
  properties.deviceName[1] = '\x01';
  properties.deviceName[2] = '\0';
  properties.deviceName[3] = '\0';
  properties.deviceName[4] = '\0';
  properties.deviceName[5] = '\0';
  properties.deviceName[6] = '\0';
  properties.deviceName[7] = '\0';
  properties.deviceName[8] = '\x02';
  properties.deviceName[9] = '\0';
  properties.deviceName[10] = '\0';
  properties.deviceName[0xb] = '\0';
  properties.deviceName[0x10] = (char)dVar14;
  properties.deviceName[0x11] = (char)(dVar14 >> 8);
  properties.deviceName[0x12] = (char)(dVar14 >> 0x10);
  properties.deviceName[0x13] = (char)(dVar14 >> 0x18);
  properties.deviceName[0xc] = (char)dVar14;
  properties.deviceName[0xd] = (char)(dVar14 >> 8);
  properties.deviceName[0xe] = (char)(dVar14 >> 0x10);
  properties.deviceName[0xf] = (char)(dVar14 >> 0x18);
  properties.deviceName[0x14] = (undefined1)local_698.m_data.object.m_internal;
  properties.deviceName[0x15] = local_698.m_data.object.m_internal._1_1_;
  properties.deviceName[0x16] = local_698.m_data.object.m_internal._2_1_;
  properties.deviceName[0x17] = local_698.m_data.object.m_internal._3_1_;
  properties.deviceName[0x18] = local_698.m_data.object.m_internal._4_1_;
  properties.deviceName[0x19] = local_698.m_data.object.m_internal._5_1_;
  properties.deviceName[0x1a] = local_698.m_data.object.m_internal._6_1_;
  properties.deviceName[0x1b] = local_698.m_data.object.m_internal._7_1_;
  properties.deviceName[0x1c] = '\x01';
  properties.deviceName[0x1d] = '\0';
  properties.deviceName[0x1e] = '\0';
  properties.deviceName[0x1f] = '\0';
  properties.deviceName[0x20] = '\0';
  properties.deviceName[0x21] = '\0';
  properties.deviceName[0x22] = '\0';
  properties.deviceName[0x23] = '\0';
  properties.deviceName[0x24] = '\x01';
  properties.deviceName[0x25] = '\0';
  properties.deviceName[0x26] = '\0';
  properties.deviceName[0x27] = '\0';
  properties.deviceName[0x28] = '\0';
  properties.deviceName[0x29] = '\0';
  properties.deviceName[0x2a] = '\0';
  properties.deviceName[0x2b] = '\0';
  properties.deviceName[0x2c] = '\x01';
  properties.deviceName[0x2d] = '\0';
  properties.deviceName[0x2e] = '\0';
  properties.deviceName[0x2f] = '\0';
  (*pDVar21->_vptr_DeviceInterface[0x6d])
            (pDVar21,attachmentReference,1,0x8000,0,0,0,0,0,1,&properties);
  (*pDVar21->_vptr_DeviceInterface[0x74])(pDVar21,attachmentReference,&offsets_1,0);
  (*pDVar21->_vptr_DeviceInterface[0x4c])
            (pDVar21,attachmentReference,0,local_188.m_data.object.m_internal);
  pRVar42 = &local_5d8;
  (*pDVar21->_vptr_DeviceInterface[0x56])
            (pDVar21,attachmentReference,0,local_5b8.m_data.object.m_internal,0,1,pRVar42,0,0);
  offsets[0] = 0;
  (*pDVar21->_vptr_DeviceInterface[0x58])(pDVar21,attachmentReference,0,1,&local_558);
  (*pDVar21->_vptr_DeviceInterface[0x57])
            (pDVar21,attachmentReference,local_578.m_data.object.m_internal,0);
  (*pDVar21->_vptr_DeviceInterface[0x5a])
            (pDVar21,attachmentReference,6,1,0,0,(ulong)pRVar42 & 0xffffffff00000000);
  (*pDVar21->_vptr_DeviceInterface[0x76])(pDVar21,attachmentReference);
  properties.apiVersion = 0x2d;
  properties.vendorID = 0;
  properties.deviceID = 0;
  properties.deviceType = 0x100;
  properties.deviceName[0] = '\0';
  properties.deviceName[1] = '\b';
  properties.deviceName[2] = '\0';
  properties.deviceName[3] = '\0';
  properties.deviceName[4] = '\x02';
  properties.deviceName[5] = '\0';
  properties.deviceName[6] = '\0';
  properties.deviceName[7] = '\0';
  properties.deviceName[8] = '\x06';
  properties.deviceName[9] = '\0';
  properties.deviceName[10] = '\0';
  properties.deviceName[0xb] = '\0';
  properties.deviceName[0x10] = (char)dVar14;
  properties.deviceName[0x11] = (char)(dVar14 >> 8);
  properties.deviceName[0x12] = (char)(dVar14 >> 0x10);
  properties.deviceName[0x13] = (char)(dVar14 >> 0x18);
  properties.deviceName[0xc] = (char)dVar14;
  properties.deviceName[0xd] = (char)(dVar14 >> 8);
  properties.deviceName[0xe] = (char)(dVar14 >> 0x10);
  properties.deviceName[0xf] = (char)(dVar14 >> 0x18);
  properties.deviceName[0x14] = (undefined1)local_698.m_data.object.m_internal;
  properties.deviceName[0x15] = local_698.m_data.object.m_internal._1_1_;
  properties.deviceName[0x16] = local_698.m_data.object.m_internal._2_1_;
  properties.deviceName[0x17] = local_698.m_data.object.m_internal._3_1_;
  properties.deviceName[0x18] = local_698.m_data.object.m_internal._4_1_;
  properties.deviceName[0x19] = local_698.m_data.object.m_internal._5_1_;
  properties.deviceName[0x1a] = local_698.m_data.object.m_internal._6_1_;
  properties.deviceName[0x1b] = local_698.m_data.object.m_internal._7_1_;
  properties.deviceName[0x1c] = '\x01';
  properties.deviceName[0x1d] = '\0';
  properties.deviceName[0x1e] = '\0';
  properties.deviceName[0x1f] = '\0';
  properties.deviceName[0x20] = '\0';
  properties.deviceName[0x21] = '\0';
  properties.deviceName[0x22] = '\0';
  properties.deviceName[0x23] = '\0';
  properties.deviceName[0x24] = '\x01';
  properties.deviceName[0x25] = '\0';
  properties.deviceName[0x26] = '\0';
  properties.deviceName[0x27] = '\0';
  properties.deviceName[0x28] = '\0';
  properties.deviceName[0x29] = '\0';
  properties.deviceName[0x2a] = '\0';
  properties.deviceName[0x2b] = '\0';
  properties.deviceName[0x2c] = '\x01';
  properties.deviceName[0x2d] = '\0';
  properties.deviceName[0x2e] = '\0';
  properties.deviceName[0x2f] = '\0';
  (*pDVar21->_vptr_DeviceInterface[0x6d])
            (pDVar21,attachmentReference,0x8000,0x1000,0,0,0,0,0,1,&properties);
  properties.deviceName[0xc] = '\0';
  properties.deviceName[0xd] = '\0';
  properties.deviceName[0xe] = '\0';
  properties.deviceName[0xf] = '\0';
  properties.deviceName[0x10] = '\0';
  properties.deviceName[0x11] = '\0';
  properties.deviceName[0x12] = '\0';
  properties.deviceName[0x13] = '\0';
  properties.deviceName[0x14] = '\0';
  properties.deviceName[0x15] = '\0';
  properties.deviceName[0x16] = '\0';
  properties.deviceName[0x17] = '\0';
  properties.deviceName[0x18] = 'd';
  properties.deviceName[0x19] = '\0';
  properties.deviceName[0x1a] = '\0';
  properties.deviceName[0x1b] = '\0';
  properties.deviceType = VK_PHYSICAL_DEVICE_TYPE_INTEGRATED_GPU;
  properties.deviceName[0] = '\0';
  properties.deviceName[1] = '\0';
  properties.deviceName[2] = '\0';
  properties.deviceName[3] = '\0';
  properties.deviceName[4] = '\0';
  properties.deviceName[5] = '\0';
  properties.deviceName[6] = '\0';
  properties.deviceName[7] = '\0';
  properties.deviceName[8] = '\x01';
  properties.deviceName[9] = '\0';
  properties.deviceName[10] = '\0';
  properties.deviceName[0xb] = '\0';
  properties.apiVersion = 0;
  properties.driverVersion = 0;
  properties.vendorID = 100;
  properties.deviceID = 100;
  properties.deviceName[0x1c] = 'd';
  properties.deviceName[0x1d] = '\0';
  properties.deviceName[0x1e] = '\0';
  properties.deviceName[0x1f] = '\0';
  properties.deviceName[0x20] = '\x01';
  properties.deviceName[0x21] = '\0';
  properties.deviceName[0x22] = '\0';
  properties.deviceName[0x23] = '\0';
  (*pDVar21->_vptr_DeviceInterface[99])
            (pDVar21,attachmentReference,local_698.m_data.object.m_internal,6,
             viewportStateParams._0_8_,1,&properties);
  properties.apiVersion = 0x2c;
  properties.vendorID = 0;
  properties.deviceID = 0;
  properties.deviceType = 0x1000;
  properties.deviceName[0] = '\0';
  properties.deviceName[1] = ' ';
  properties.deviceName[2] = '\0';
  properties.deviceName[3] = '\0';
  properties.deviceName[8] = (char)dVar14;
  properties.deviceName[9] = (char)(dVar14 >> 8);
  properties.deviceName[10] = (char)(dVar14 >> 0x10);
  properties.deviceName[0xb] = (char)(dVar14 >> 0x18);
  properties.deviceName[4] = (char)dVar14;
  properties.deviceName[5] = (char)(dVar14 >> 8);
  properties.deviceName[6] = (char)(dVar14 >> 0x10);
  properties.deviceName[7] = (char)(dVar14 >> 0x18);
  properties.deviceName._12_8_ = viewportStateParams._0_8_;
  properties.deviceName[0x14] = '\0';
  properties.deviceName[0x15] = '\0';
  properties.deviceName[0x16] = '\0';
  properties.deviceName[0x17] = '\0';
  properties.deviceName[0x18] = '\0';
  properties.deviceName[0x19] = '\0';
  properties.deviceName[0x1a] = '\0';
  properties.deviceName[0x1b] = '\0';
  properties.deviceName[0x1c] = '@';
  properties.deviceName[0x1d] = -100;
  properties.deviceName[0x1e] = '\0';
  properties.deviceName[0x1f] = '\0';
  properties.deviceName[0x20] = '\0';
  properties.deviceName[0x21] = '\0';
  properties.deviceName[0x22] = '\0';
  properties.deviceName[0x23] = '\0';
  (*pDVar21->_vptr_DeviceInterface[0x6d])
            (pDVar21,attachmentReference,0x1000,0x4000,0,0,0,1,&properties,0,0);
  VVar17 = (*pDVar21->_vptr_DeviceInterface[0x4a])(pDVar21,attachmentReference);
  ::vk::checkResult(VVar17,"vk.endCommandBuffer(*cmdBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/ubo/vktUniformBlockCase.cpp"
                    ,0x72e);
  ::vk::createFence((Move<vk::Handle<(vk::HandleType)6>_> *)&properties,pDVar21,device,0,
                    (VkAllocationCallbacks *)0x0);
  local_7c8._M_allocated_capacity._0_4_ = properties.deviceType;
  local_7c8._M_local_buf[4] = properties.deviceName[0];
  local_7c8._M_local_buf[5] = properties.deviceName[1];
  local_7c8._M_local_buf[6] = properties.deviceName[2];
  local_7c8._M_local_buf[7] = properties.deviceName[3];
  local_7c8._M_local_buf[8] = properties.deviceName[4];
  local_7c8._M_local_buf[9] = properties.deviceName[5];
  local_7c8._M_local_buf[10] = properties.deviceName[6];
  local_7c8._M_local_buf[0xb] = properties.deviceName[7];
  local_7c8._M_local_buf[0xc] = properties.deviceName[8];
  local_7c8._M_local_buf[0xd] = properties.deviceName[9];
  local_7c8._M_local_buf[0xe] = properties.deviceName[10];
  local_7c8._M_local_buf[0xf] = properties.deviceName[0xb];
  queueFamilyIndex = properties.apiVersion;
  CStack_7d4 = properties.driverVersion;
  p_Stack_7d0 = (_Base_ptr)properties._8_8_;
  properties.apiVersion = 0;
  properties.driverVersion = 0;
  properties.vendorID = 0;
  properties.deviceID = 0;
  properties.deviceType = VK_PHYSICAL_DEVICE_TYPE_OTHER;
  properties.deviceName[0] = '\0';
  properties.deviceName[1] = '\0';
  properties.deviceName[2] = '\0';
  properties.deviceName[3] = '\0';
  properties.deviceName[4] = '\0';
  properties.deviceName[5] = '\0';
  properties.deviceName[6] = '\0';
  properties.deviceName[7] = '\0';
  properties.deviceName[8] = '\0';
  properties.deviceName[9] = '\0';
  properties.deviceName[10] = '\0';
  properties.deviceName[0xb] = '\0';
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)6>_> *)&properties);
  properties.vendorID = 0;
  properties.deviceID = 0;
  properties.deviceName[0xc] = '\0';
  properties.deviceName[0xd] = '\0';
  properties.deviceName[0xe] = '\0';
  properties.deviceName[0xf] = '\0';
  properties.deviceName[0x10] = '\0';
  properties.deviceName[0x11] = '\0';
  properties.deviceName[0x12] = '\0';
  properties.deviceName[0x13] = '\0';
  properties.deviceName[0x24] = '\0';
  properties.deviceName[0x25] = '\0';
  properties.deviceName[0x26] = '\0';
  properties.deviceName[0x27] = '\0';
  properties.deviceName[0x28] = '\0';
  properties.deviceName[0x29] = '\0';
  properties.deviceName[0x2a] = '\0';
  properties.deviceName[0x2b] = '\0';
  properties.deviceType = VK_PHYSICAL_DEVICE_TYPE_OTHER;
  properties.deviceName[0] = '\0';
  properties.deviceName[1] = '\0';
  properties.deviceName[2] = '\0';
  properties.deviceName[3] = '\0';
  properties.deviceName[4] = '\0';
  properties.deviceName[5] = '\0';
  properties.deviceName[6] = '\0';
  properties.deviceName[7] = '\0';
  properties.deviceName[8] = '\0';
  properties.deviceName[9] = '\0';
  properties.deviceName[10] = '\0';
  properties.deviceName[0xb] = '\0';
  properties.deviceName[0x2c] = '\0';
  properties.deviceName[0x2d] = '\0';
  properties.deviceName[0x2e] = '\0';
  properties.deviceName[0x2f] = '\0';
  properties.deviceName[0x30] = '\0';
  properties.deviceName[0x31] = '\0';
  properties.deviceName[0x32] = '\0';
  properties.deviceName[0x33] = '\0';
  properties.apiVersion = 4;
  properties.driverVersion = 0;
  properties.deviceName[0x14] = '\x01';
  properties.deviceName[0x15] = '\0';
  properties.deviceName[0x16] = '\0';
  properties.deviceName[0x17] = '\0';
  properties.deviceName[0x18] = '\0';
  properties.deviceName[0x19] = '\0';
  properties.deviceName[0x1a] = '\0';
  properties.deviceName[0x1b] = '\0';
  properties.deviceName._28_8_ = &attachmentReference;
  VVar17 = (*pDVar21->_vptr_DeviceInterface[2])(pDVar21,pVVar18,1,&properties,_queueFamilyIndex);
  ::vk::checkResult(VVar17,"vk.queueSubmit(queue, 1u, &submitInfo, *fence)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/ubo/vktUniformBlockCase.cpp"
                    ,0x741);
  VVar17 = (*pDVar21->_vptr_DeviceInterface[0x16])
                     (pDVar21,device,1,&queueFamilyIndex,1,0xffffffffffffffff);
  ::vk::checkResult(VVar17,"vk.waitForFences(device, 1u, &fence.get(), DE_TRUE, ~0ull)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/ubo/vktUniformBlockCase.cpp"
                    ,0x742);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)6>_> *)&queueFamilyIndex);
  tcu::Surface::Surface(&surface,100,100);
  inputAssemblyStateParams.sType = VK_STRUCTURE_TYPE_FENCE_CREATE_INFO;
  inputAssemblyStateParams._4_4_ = 3;
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            ((ConstPixelBufferAccess *)&properties,(TextureFormat *)&inputAssemblyStateParams,100,
             100,1,(readImageAlloc.
                    super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr
                   )->m_hostPtr);
  ::vk::invalidateMappedMemoryRange
            (pDVar21,device,
             (VkDeviceMemory)
             ((readImageAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
               m_data.ptr)->m_memory).m_internal,
             (readImageAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
              m_data.ptr)->m_offset,40000);
  tcu::Surface::getAccess((PixelBufferAccess *)&queueFamilyIndex,&surface);
  tcu::copy((EVP_PKEY_CTX *)&queueFamilyIndex,(EVP_PKEY_CTX *)&properties);
  iVar37 = 0;
  uVar40 = 0;
  if (0 < surface.m_width) {
    uVar40 = surface._0_8_ & 0xffffffff;
  }
  iVar33 = surface.m_height;
  if (surface.m_height < 1) {
    iVar33 = 0;
  }
  iVar36 = 0;
  for (iVar38 = 0; uVar24 = uVar40, iVar39 = iVar37, iVar38 != iVar33; iVar38 = iVar38 + 1) {
    while (uVar24 != 0) {
      iVar36 = iVar36 + (uint)(*(int *)((long)surface.m_pixels.m_ptr + (long)iVar39 * 4) != -1);
      uVar24 = uVar24 - 1;
      iVar39 = iVar39 + 1;
    }
    iVar37 = iVar37 + surface.m_width;
  }
  if (iVar36 < 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&properties,"Full white image ok",(allocator<char> *)&queueFamilyIndex);
    pTVar35 = local_6a8;
    tcu::TestStatus::pass(local_6a8,(string *)&properties);
  }
  else {
    pTVar7 = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&queueFamilyIndex,"Image",(allocator<char> *)&scissor);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&inputAssemblyStateParams,"Rendered image",
               (allocator<char> *)&vertexBinding);
    surface_00 = &surface;
    tcu::LogImage::LogImage
              ((LogImage *)&properties,(string *)&queueFamilyIndex,
               (string *)&inputAssemblyStateParams,surface_00,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)&properties,(int)pTVar7,__buf,(size_t)surface_00);
    tcu::LogImage::~LogImage((LogImage *)&properties);
    std::__cxx11::string::~string((string *)&inputAssemblyStateParams);
    std::__cxx11::string::~string((string *)&queueFamilyIndex);
    pdVar2 = &properties.vendorID;
    properties._0_8_ = pTVar7;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)pdVar2);
    std::operator<<((ostream *)pdVar2,"Image comparison failed, got ");
    std::ostream::operator<<(pdVar2,iVar36);
    std::operator<<((ostream *)pdVar2," non-white pixels");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&properties,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)pdVar2);
    pdVar2 = &properties.vendorID;
    lVar27 = 0;
    uVar40 = 0;
    while( true ) {
      pUVar34 = this->m_layout;
      pBVar5 = (pUVar34->blocks).
               super__Vector_base<vkt::ubo::BlockLayoutEntry,_std::allocator<vkt::ubo::BlockLayoutEntry>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)(((long)(pUVar34->blocks).
                         super__Vector_base<vkt::ubo::BlockLayoutEntry,_std::allocator<vkt::ubo::BlockLayoutEntry>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar5) / 0x50) <=
          uVar40) break;
      properties._0_8_ = pTVar7;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)pdVar2);
      std::operator<<((ostream *)pdVar2,"Block index: ");
      std::ostream::_M_insert<unsigned_long>((ulong)pdVar2);
      std::operator<<((ostream *)pdVar2," infos: ");
      ubo::operator<<((ostream *)pdVar2,
                      (BlockLayoutEntry *)((long)&(pBVar5->name)._M_dataplus._M_p + lVar27));
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&properties,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)pdVar2);
      uVar40 = uVar40 + 1;
      lVar27 = lVar27 + 0x50;
    }
    pdVar2 = &properties.vendorID;
    lVar27 = 0;
    for (uVar40 = 0;
        uVar40 < (ulong)((long)(pUVar34->uniforms).
                               super__Vector_base<vkt::ubo::UniformLayoutEntry,_std::allocator<vkt::ubo::UniformLayoutEntry>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(pUVar34->uniforms).
                               super__Vector_base<vkt::ubo::UniformLayoutEntry,_std::allocator<vkt::ubo::UniformLayoutEntry>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 6); uVar40 = uVar40 + 1)
    {
      properties._0_8_ = pTVar7;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)pdVar2);
      std::operator<<((ostream *)pdVar2,"Uniform index: ");
      std::ostream::_M_insert<unsigned_long>((ulong)pdVar2);
      std::operator<<((ostream *)pdVar2," infos: ");
      ubo::operator<<((ostream *)pdVar2,
                      (UniformLayoutEntry *)
                      ((long)&(((this->m_layout->uniforms).
                                super__Vector_base<vkt::ubo::UniformLayoutEntry,_std::allocator<vkt::ubo::UniformLayoutEntry>_>
                                ._M_impl.super__Vector_impl_data._M_start)->name)._M_dataplus._M_p +
                      lVar27));
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&properties,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)pdVar2);
      pUVar34 = this->m_layout;
      lVar27 = lVar27 + 0x40;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&properties,"Detected non-white pixels",
               (allocator<char> *)&queueFamilyIndex);
    pTVar35 = local_6a8;
    tcu::TestStatus::fail(local_6a8,(string *)&properties);
  }
  std::__cxx11::string::~string((string *)&properties);
  tcu::Surface::~Surface(&surface);
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
            (&readImageAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)8>_> *)&viewportStateParams);
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
            ((RefBase<vk::VkCommandBuffer_s_*> *)&attachmentReference);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)24>_> *)&local_6e8);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase(&local_188);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase(&local_168);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase(&local_148);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase(&local_5b8);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::~RefBase(&local_128);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::~RefBase(&local_5f8);
  std::_Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>::
  ~_Vector_base(&descriptors.
                 super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
               );
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::~RefBase(&local_5d8);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::~RefBase(&local_108);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::~RefBase(&local_598);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::~RefBase(&local_e8);
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
            (&colorImageAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>)
  ;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::~RefBase(&local_698);
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
            (&indicesAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase(&local_578);
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
            (&positionsAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase(&local_558);
  return pTVar35;
}

Assistant:

tcu::TestStatus UniformBlockCaseInstance::iterate (void)
{
	const vk::DeviceInterface&		vk					= m_context.getDeviceInterface();
	const vk::VkDevice				device				= m_context.getDevice();
	const vk::VkQueue				queue				= m_context.getUniversalQueue();
	const deUint32					queueFamilyIndex	= m_context.getUniversalQueueFamilyIndex();

	const float positions[] =
	{
		-1.0f, -1.0f, 0.0f, 1.0f,
		-1.0f, +1.0f, 0.0f, 1.0f,
		+1.0f, -1.0f, 0.0f, 1.0f,
		+1.0f, +1.0f, 0.0f, 1.0f
	};

	const deUint32 indices[] = { 0, 1, 2, 2, 1, 3 };

	vk::Unique<VkBuffer>				positionsBuffer		(createBuffer(m_context, sizeof(positions), vk::VK_BUFFER_USAGE_VERTEX_BUFFER_BIT));
	de::UniquePtr<Allocation>			positionsAlloc		(allocateAndBindMemory(m_context, *positionsBuffer, MemoryRequirement::HostVisible));
	vk::Unique<VkBuffer>				indicesBuffer		(createBuffer(m_context, sizeof(indices), vk::VK_BUFFER_USAGE_INDEX_BUFFER_BIT|vk::VK_BUFFER_USAGE_VERTEX_BUFFER_BIT));
	de::UniquePtr<Allocation>			indicesAlloc		(allocateAndBindMemory(m_context, *indicesBuffer, MemoryRequirement::HostVisible));

	int minUniformBufferOffsetAlignment = getminUniformBufferOffsetAlignment(m_context);

	// Upload attrbiutes data
	{
		deMemcpy(positionsAlloc->getHostPtr(), positions, sizeof(positions));
		flushMappedMemoryRange(vk, device, positionsAlloc->getMemory(), positionsAlloc->getOffset(), sizeof(positions));

		deMemcpy(indicesAlloc->getHostPtr(), indices, sizeof(indices));
		flushMappedMemoryRange(vk, device, indicesAlloc->getMemory(), indicesAlloc->getOffset(), sizeof(indices));
	}

	vk::Unique<VkImage>					colorImage			(createImage2D(m_context,
																			RENDER_WIDTH,
																			RENDER_HEIGHT,
																			vk::VK_FORMAT_R8G8B8A8_UNORM,
																			vk::VK_IMAGE_TILING_OPTIMAL,
																			vk::VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT|vk::VK_IMAGE_USAGE_TRANSFER_SRC_BIT));
	de::UniquePtr<Allocation>			colorImageAlloc		(allocateAndBindMemory(m_context, *colorImage, MemoryRequirement::Any));
	vk::Unique<VkImageView>				colorImageView		(createAttachmentView(m_context, *colorImage, vk::VK_FORMAT_R8G8B8A8_UNORM));

	vk::Unique<VkDescriptorSetLayout>	descriptorSetLayout	(createDescriptorSetLayout());
	vk::Unique<VkDescriptorPool>		descriptorPool		(createDescriptorPool());

	const VkDescriptorSetAllocateInfo	descriptorSetAllocateInfo =
	{
		VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO,		// VkStructureType				sType;
		DE_NULL,											// const void*					pNext;
		*descriptorPool,									// VkDescriptorPool				descriptorPool;
		1u,													// deUint32						setLayoutCount;
		&descriptorSetLayout.get()							// const VkDescriptorSetLayout*	pSetLayouts;
	};

	vk::Unique<VkDescriptorSet>			descriptorSet(vk::allocateDescriptorSet(vk, device, &descriptorSetAllocateInfo));
	int									numBlocks = (int)m_layout.blocks.size();
	std::vector<vk::VkDescriptorBufferInfo>	descriptors(numBlocks);

	// Upload uniform data
	{
		vk::DescriptorSetUpdateBuilder	descriptorSetUpdateBuilder;

		if (m_bufferMode == UniformBlockCase::BUFFERMODE_PER_BLOCK)
		{
			for (int blockNdx = 0; blockNdx < numBlocks; blockNdx++)
			{
				const BlockLayoutEntry& block = m_layout.blocks[blockNdx];
				const void*	srcPtr = m_blockPointers.find(blockNdx)->second;

				descriptors[blockNdx] = addUniformData(block.size, srcPtr);
				descriptorSetUpdateBuilder.writeSingle(*descriptorSet, vk::DescriptorSetUpdateBuilder::Location::bindingArrayElement(block.bindingNdx, block.instanceNdx),
														VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, &descriptors[blockNdx]);
			}
		}
		else
		{
			int currentOffset = 0;
			std::map<int, int> offsets;
			for (int blockNdx = 0; blockNdx < numBlocks; blockNdx++)
			{
				if (minUniformBufferOffsetAlignment > 0)
					currentOffset = deAlign32(currentOffset, minUniformBufferOffsetAlignment);
				offsets[blockNdx] = currentOffset;
				currentOffset += m_layout.blocks[blockNdx].size;
			}

			deUint32 totalSize = currentOffset;

			// Make a copy of the data that satisfies the device's min uniform buffer alignment
			std::vector<deUint8> data;
			data.resize(totalSize);
			for (int blockNdx = 0; blockNdx < numBlocks; blockNdx++)
			{
				deMemcpy(&data[offsets[blockNdx]], m_blockPointers.find(blockNdx)->second, m_layout.blocks[blockNdx].size);
			}

			vk::VkBuffer buffer = addUniformData(totalSize, &data[0]).buffer;

			for (int blockNdx = 0; blockNdx < numBlocks; blockNdx++)
			{
				const BlockLayoutEntry& block = m_layout.blocks[blockNdx];
				deUint32 size = block.size;

				const VkDescriptorBufferInfo	descriptor =
				{
					buffer,							// VkBuffer		buffer;
					(deUint32)offsets[blockNdx],	// VkDeviceSize	offset;
					size,							// VkDeviceSize	range;
				};

				descriptors[blockNdx] = descriptor;
				descriptorSetUpdateBuilder.writeSingle(*descriptorSet,
														vk::DescriptorSetUpdateBuilder::Location::bindingArrayElement(block.bindingNdx, block.instanceNdx),
														VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,
														&descriptors[blockNdx]);
			}
		}

		descriptorSetUpdateBuilder.update(vk, device);
	}

	vk::Unique<VkRenderPass>			renderPass			(createRenderPass(vk::VK_FORMAT_R8G8B8A8_UNORM));
	vk::Unique<VkFramebuffer>			framebuffer			(createFramebuffer(*renderPass, *colorImageView));
	vk::Unique<VkPipelineLayout>		pipelineLayout		(createPipelineLayout(m_context, *descriptorSetLayout));

	vk::Unique<VkShaderModule>			vtxShaderModule		(vk::createShaderModule(vk, device, m_context.getBinaryCollection().get("vert"), 0));
	vk::Unique<VkShaderModule>			fragShaderModule	(vk::createShaderModule(vk, device, m_context.getBinaryCollection().get("frag"), 0));
	vk::Unique<VkPipeline>				pipeline			(createPipeline(*vtxShaderModule, *fragShaderModule, *pipelineLayout, *renderPass));
	vk::Unique<VkCommandPool>			cmdPool				(createCmdPool(m_context));
	vk::Unique<VkCommandBuffer>			cmdBuffer			(createCmdBuffer(m_context, *cmdPool));
	vk::Unique<VkBuffer>				readImageBuffer		(createBuffer(m_context, (vk::VkDeviceSize)(RENDER_WIDTH * RENDER_HEIGHT * 4), vk::VK_BUFFER_USAGE_TRANSFER_DST_BIT));
	de::UniquePtr<Allocation>			readImageAlloc		(allocateAndBindMemory(m_context, *readImageBuffer, vk::MemoryRequirement::HostVisible));

	// Record command buffer
	const vk::VkCommandBufferBeginInfo beginInfo	=
	{
		vk::VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,	// VkStructureType					sType;
		DE_NULL,											// const void*						pNext;
		0u,													// VkCommandBufferUsageFlags		flags;
		(const vk::VkCommandBufferInheritanceInfo*)DE_NULL,
	};
	VK_CHECK(vk.beginCommandBuffer(*cmdBuffer, &beginInfo));

	const vk::VkClearValue clearValue = vk::makeClearValueColorF32(0.125f, 0.25f, 0.75f, 1.0f);
	const vk::VkRenderPassBeginInfo passBeginInfo	=
	{
		vk::VK_STRUCTURE_TYPE_RENDER_PASS_BEGIN_INFO,	// VkStructureType		sType;
		DE_NULL,										// const void*			pNext;
		*renderPass,									// VkRenderPass			renderPass;
		*framebuffer,									// VkFramebuffer		framebuffer;
		{ { 0, 0 }, { RENDER_WIDTH, RENDER_HEIGHT } },	// VkRect2D				renderArea;
		1u,												// deUint32				clearValueCount;
		&clearValue,									// const VkClearValue*	pClearValues;
	};

	// Add barrier for initializing image state
	{
		const vk::VkImageMemoryBarrier  initializeBarrier =
		{
			vk::VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,		// VkStructureType			sType;
			DE_NULL,										// const void*				pNext
			0,												// VVkAccessFlags			srcAccessMask;
			vk::VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT,		// VkAccessFlags			dstAccessMask;
			vk::VK_IMAGE_LAYOUT_UNDEFINED,					// VkImageLayout			oldLayout;
			vk::VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,	// VkImageLayout			newLayout;
			queueFamilyIndex,								// deUint32					srcQueueFamilyIndex;
			queueFamilyIndex,								// deUint32					dstQueueFamilyIndex;
			*colorImage,									// VkImage					image;
			{
				vk::VK_IMAGE_ASPECT_COLOR_BIT,			// VkImageAspectFlags	aspectMask;
				0u,										// deUint32				baseMipLevel;
				1u,										// deUint32				mipLevels;
				0u,										// deUint32				baseArraySlice;
				1u,										// deUint32				arraySize;
			}												// VkImageSubresourceRange	subresourceRange
		};

		vk.cmdPipelineBarrier(*cmdBuffer, vk::VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, vk::VK_PIPELINE_STAGE_ALL_GRAPHICS_BIT, (vk::VkDependencyFlags)0,
			0, (const vk::VkMemoryBarrier*)DE_NULL,
			0, (const vk::VkBufferMemoryBarrier*)DE_NULL,
			1, &initializeBarrier);
	}

	vk.cmdBeginRenderPass(*cmdBuffer, &passBeginInfo, vk::VK_SUBPASS_CONTENTS_INLINE);

	vk.cmdBindPipeline(*cmdBuffer, vk::VK_PIPELINE_BIND_POINT_GRAPHICS, *pipeline);
	vk.cmdBindDescriptorSets(*cmdBuffer, vk::VK_PIPELINE_BIND_POINT_GRAPHICS, *pipelineLayout, 0u, 1u, &*descriptorSet, 0u, DE_NULL);

	const vk::VkDeviceSize offsets[] = { 0u };
	vk.cmdBindVertexBuffers(*cmdBuffer, 0u, 1u, &*positionsBuffer, offsets);
	vk.cmdBindIndexBuffer(*cmdBuffer, *indicesBuffer, (vk::VkDeviceSize)0, vk::VK_INDEX_TYPE_UINT32);

	vk.cmdDrawIndexed(*cmdBuffer, DE_LENGTH_OF_ARRAY(indices), 1u, 0u, 0u, 0u);
	vk.cmdEndRenderPass(*cmdBuffer);

	// Add render finish barrier
	{
		const vk::VkImageMemoryBarrier  renderFinishBarrier =
		{
			vk::VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,		// VkStructureType			sType;
			DE_NULL,										// const void*				pNext
			vk::VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT,		// VVkAccessFlags			srcAccessMask;
			vk::VK_ACCESS_TRANSFER_READ_BIT,				// VkAccessFlags			dstAccessMask;
			vk::VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,	// VkImageLayout			oldLayout;
			vk::VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,		// VkImageLayout			newLayout;
			queueFamilyIndex,								// deUint32					srcQueueFamilyIndex;
			queueFamilyIndex,								// deUint32					dstQueueFamilyIndex;
			*colorImage,									// VkImage					image;
			{
				vk::VK_IMAGE_ASPECT_COLOR_BIT,			// VkImageAspectFlags	aspectMask;
				0u,										// deUint32				baseMipLevel;
				1u,										// deUint32				mipLevels;
				0u,										// deUint32				baseArraySlice;
				1u,										// deUint32				arraySize;
			}												// VkImageSubresourceRange	subresourceRange
		};

		vk.cmdPipelineBarrier(*cmdBuffer, vk::VK_PIPELINE_STAGE_ALL_GRAPHICS_BIT, vk::VK_PIPELINE_STAGE_TRANSFER_BIT, (vk::VkDependencyFlags)0,
							  0, (const vk::VkMemoryBarrier*)DE_NULL,
							  0, (const vk::VkBufferMemoryBarrier*)DE_NULL,
							  1, &renderFinishBarrier);
	}

	// Add Image->Buffer copy command
	{
		const vk::VkBufferImageCopy copyParams =
		{
			(vk::VkDeviceSize)0u,					// VkDeviceSize				bufferOffset;
			(deUint32)RENDER_WIDTH,					// deUint32					bufferRowLength;
			(deUint32)RENDER_HEIGHT,				// deUint32					bufferImageHeight;
			{
				vk::VK_IMAGE_ASPECT_COLOR_BIT,	// VkImageAspect	aspect;
				0u,								// deUint32			mipLevel;
				0u,								// deUint32			arrayLayer;
				1u,								// deUint32			arraySize;
			},										// VkImageSubresourceCopy	imageSubresource
			{ 0u, 0u, 0u },							// VkOffset3D				imageOffset;
			{ RENDER_WIDTH, RENDER_HEIGHT, 1u }		// VkExtent3D				imageExtent;
		};

		vk.cmdCopyImageToBuffer(*cmdBuffer, *colorImage, vk::VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, *readImageBuffer, 1u, &copyParams);
	}

	// Add copy finish barrier
	{
		const vk::VkBufferMemoryBarrier copyFinishBarrier	=
		{
			vk::VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER,		// VkStructureType		sType;
			DE_NULL,											// const void*			pNext;
			VK_ACCESS_TRANSFER_WRITE_BIT,						// VkAccessFlags		srcAccessMask;
			VK_ACCESS_HOST_READ_BIT,							// VkAccessFlags		dstAccessMask;
			queueFamilyIndex,									// deUint32				srcQueueFamilyIndex;
			queueFamilyIndex,									// deUint32				destQueueFamilyIndex;
			*readImageBuffer,									// VkBuffer				buffer;
			0u,													// VkDeviceSize			offset;
			(vk::VkDeviceSize)(RENDER_WIDTH * RENDER_HEIGHT * 4)// VkDeviceSize			size;
		};

		vk.cmdPipelineBarrier(*cmdBuffer, vk::VK_PIPELINE_STAGE_TRANSFER_BIT, vk::VK_PIPELINE_STAGE_HOST_BIT, (vk::VkDependencyFlags)0,
							  0, (const vk::VkMemoryBarrier*)DE_NULL,
							  1, &copyFinishBarrier,
							  0, (const vk::VkImageMemoryBarrier*)DE_NULL);
	}

	VK_CHECK(vk.endCommandBuffer(*cmdBuffer));

	// Submit the command buffer
	{
		const Unique<vk::VkFence> fence(vk::createFence(vk, device));

		const VkSubmitInfo			submitInfo	=
		{
			VK_STRUCTURE_TYPE_SUBMIT_INFO,	// VkStructureType			sType;
			DE_NULL,						// const void*				pNext;
			0u,								// deUint32					waitSemaphoreCount;
			DE_NULL,						// const VkSemaphore*		pWaitSemaphores;
			(const VkPipelineStageFlags*)DE_NULL,
			1u,								// deUint32					commandBufferCount;
			&cmdBuffer.get(),				// const VkCommandBuffer*	pCommandBuffers;
			0u,								// deUint32					signalSemaphoreCount;
			DE_NULL							// const VkSemaphore*		pSignalSemaphores;
		};

		VK_CHECK(vk.queueSubmit(queue, 1u, &submitInfo, *fence));
		VK_CHECK(vk.waitForFences(device, 1u, &fence.get(), DE_TRUE, ~0ull));
	}

	// Read back the results
	tcu::Surface surface(RENDER_WIDTH, RENDER_HEIGHT);
	{
		const tcu::TextureFormat textureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8);
		const tcu::ConstPixelBufferAccess imgAccess(textureFormat, RENDER_WIDTH, RENDER_HEIGHT, 1, readImageAlloc->getHostPtr());
		const vk::VkDeviceSize bufferSize = RENDER_WIDTH * RENDER_HEIGHT * 4;
		invalidateMappedMemoryRange(vk, device, readImageAlloc->getMemory(), readImageAlloc->getOffset(), bufferSize);

		tcu::copy(surface.getAccess(), imgAccess);
	}

	// Check if the result image is all white
	tcu::RGBA white(tcu::RGBA::white());
	int numFailedPixels = 0;

	for (int y = 0; y < surface.getHeight(); y++)
	{
		for (int x = 0; x < surface.getWidth(); x++)
		{
			if (surface.getPixel(x, y) != white)
				numFailedPixels += 1;
		}
	}

	if (numFailedPixels > 0)
	{
		tcu::TestLog& log = m_context.getTestContext().getLog();
		log << tcu::TestLog::Image("Image", "Rendered image", surface);
		log << tcu::TestLog::Message << "Image comparison failed, got " << numFailedPixels << " non-white pixels" << tcu::TestLog::EndMessage;

		for (size_t blockNdx = 0; blockNdx < m_layout.blocks.size(); blockNdx++)
		{
			const BlockLayoutEntry& block = m_layout.blocks[blockNdx];
			log << tcu::TestLog::Message << "Block index: " << blockNdx << " infos: " << block << tcu::TestLog::EndMessage;
		}

		for (size_t uniformNdx = 0; uniformNdx < m_layout.uniforms.size(); uniformNdx++)
		{
			log << tcu::TestLog::Message << "Uniform index: " << uniformNdx << " infos: " << m_layout.uniforms[uniformNdx] << tcu::TestLog::EndMessage;
		}

		return tcu::TestStatus::fail("Detected non-white pixels");
	}
	else
		return tcu::TestStatus::pass("Full white image ok");
}